

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx2.cpp
# Opt level: O2

int __thiscall
ncnn::Cast_x86_avx2::forward(Cast_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int i;
  uint uVar3;
  int iVar4;
  int iVar5;
  int _c;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  _func_int *p_Var9;
  long lVar10;
  uint uVar11;
  undefined1 (*pauVar12) [32];
  undefined1 (*pauVar13) [16];
  undefined1 (*pauVar14) [32];
  int iVar15;
  int iVar16;
  undefined1 (*pauVar17) [16];
  size_t _elemsize;
  bool bVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  m128i fp16;
  m256i mask;
  undefined1 local_110 [5] [16];
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  p_Var9 = this->_vptr_Cast_x86_avx2[-3];
  if (*(int *)(&this->field_0xd0 + (long)p_Var9) == *(int *)(&this->field_0xd4 + (long)p_Var9)) {
    Mat::operator=(top_blob,bottom_blob);
    return 0;
  }
  iVar16 = bottom_blob->w;
  iVar6 = bottom_blob->h;
  iVar15 = bottom_blob->d;
  _c = bottom_blob->c;
  iVar5 = bottom_blob->dims;
  iVar4 = bottom_blob->elempack;
  _elemsize = (size_t)iVar4;
  switch(*(int *)(&this->field_0xd4 + (long)p_Var9)) {
  case 1:
    if (*(int *)(&this->field_0xd0 + (long)p_Var9) == 3) {
      Cast::forward((Cast *)((long)&this->_vptr_Cast_x86_avx2 + (long)p_Var9),bottom_blob,top_blob,
                    opt);
    }
    _elemsize = _elemsize * 4;
    break;
  case 2:
  case 4:
    _elemsize = (size_t)(iVar4 * 2);
    break;
  case 3:
    break;
  default:
    _elemsize = bottom_blob->elemsize;
  }
  switch(iVar5) {
  case 1:
    Mat::create(top_blob,iVar16,_elemsize,iVar4,opt->blob_allocator);
    break;
  case 2:
    Mat::create(top_blob,iVar16,iVar6,_elemsize,iVar4,opt->blob_allocator);
    break;
  case 3:
    Mat::create(top_blob,iVar16,iVar6,_c,_elemsize,iVar4,opt->blob_allocator);
    break;
  case 4:
    Mat::create(top_blob,iVar16,iVar6,iVar15,_c,_elemsize,iVar4,opt->blob_allocator);
  }
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  uVar3 = iVar15 * iVar4 * iVar6 * iVar16;
  p_Var9 = this->_vptr_Cast_x86_avx2[-3];
  iVar16 = *(int *)(&this->field_0xd0 + (long)p_Var9);
  iVar6 = (int)uVar3 >> 3;
  if (iVar16 == 1) {
    if (*(int *)(&this->field_0xd4 + (long)p_Var9) != 2) goto LAB_002bf235;
    local_c0 = 0;
    uStack_b8 = 0;
    uStack_b0 = 0;
    uStack_a8 = 0;
    for (uVar8 = 0; auVar19 = local_a0, (uVar3 & 7) != uVar8; uVar8 = uVar8 + 1) {
      *(undefined4 *)((long)&local_c0 + uVar8 * 4) = 0x80000000;
    }
    local_80._8_8_ = uStack_b8;
    local_80._0_8_ = local_c0;
    local_80._16_8_ = uStack_b0;
    local_80._24_8_ = uStack_a8;
    local_a0._4_4_ = 0;
    local_a0._0_4_ = (uVar3 & 7) * 2;
    local_a0._8_24_ = auVar19._8_24_;
    iVar15 = 0;
    iVar16 = iVar6;
    if (iVar6 < 1) {
      iVar16 = 0;
    }
    iVar5 = 0;
    if (0 < _c) {
      iVar5 = _c;
    }
    for (; iVar15 != iVar5; iVar15 = iVar15 + 1) {
      Mat::channel((Mat *)local_110,bottom_blob,iVar15);
      pauVar12 = (undefined1 (*) [32])local_110[0]._0_8_;
      Mat::~Mat((Mat *)local_110);
      Mat::channel((Mat *)local_110,top_blob,iVar15);
      pauVar13 = (undefined1 (*) [16])local_110[0]._0_8_;
      Mat::~Mat((Mat *)local_110);
      iVar4 = iVar16;
      while (bVar18 = iVar4 != 0, iVar4 = iVar4 + -1, bVar18) {
        auVar1 = vcvtps2ph_f16c(*pauVar12,3);
        *pauVar13 = auVar1;
        pauVar12 = pauVar12 + 1;
        pauVar13 = pauVar13 + 1;
      }
      if ((uVar3 & 7) != 0) {
        auVar19 = vmaskmovps_avx(local_80,*pauVar12);
        local_110[0] = vcvtps2ph_f16c(auVar19,3);
        memcpy(pauVar13,(Mat *)local_110,local_a0._0_8_);
      }
    }
    p_Var9 = this->_vptr_Cast_x86_avx2[-3];
    iVar16 = *(int *)(&this->field_0xd0 + (long)p_Var9);
  }
  if (iVar16 == 2) {
    if (*(int *)(&this->field_0xd4 + (long)p_Var9) != 1) {
      return 0;
    }
    local_c0 = 0;
    uStack_b8 = 0;
    uStack_b0 = 0;
    uStack_a8 = 0;
    for (uVar8 = 0; auVar19 = local_80, (uVar3 & 7) != uVar8; uVar8 = uVar8 + 1) {
      *(undefined4 *)((long)&local_c0 + uVar8 * 4) = 0x80000000;
    }
    local_80._4_4_ = 0;
    local_80._0_4_ = (uVar3 & 7) * 2;
    local_80._8_24_ = auVar19._8_24_;
    local_a0._8_8_ = uStack_b8;
    local_a0._0_8_ = local_c0;
    local_a0._16_8_ = uStack_b0;
    local_a0._24_8_ = uStack_a8;
    iVar15 = 0;
    iVar16 = iVar6;
    if (iVar6 < 1) {
      iVar16 = 0;
    }
    iVar5 = 0;
    if (0 < _c) {
      iVar5 = _c;
    }
    for (; iVar15 != iVar5; iVar15 = iVar15 + 1) {
      Mat::channel((Mat *)local_110,bottom_blob,iVar15);
      pauVar13 = (undefined1 (*) [16])local_110[0]._0_8_;
      Mat::~Mat((Mat *)local_110);
      Mat::channel((Mat *)local_110,top_blob,iVar15);
      pauVar12 = (undefined1 (*) [32])local_110[0]._0_8_;
      Mat::~Mat((Mat *)local_110);
      iVar4 = iVar16;
      while (bVar18 = iVar4 != 0, iVar4 = iVar4 + -1, bVar18) {
        auVar1 = vlddqu_avx(*pauVar13);
        auVar19 = vcvtph2ps_f16c(auVar1);
        *pauVar12 = auVar19;
        pauVar13 = pauVar13 + 1;
        pauVar12 = pauVar12 + 1;
      }
      if ((uVar3 & 7) != 0) {
        local_110[0] = ZEXT816(0);
        memcpy((Mat *)local_110,pauVar13,local_80._0_8_);
        auVar19 = vcvtph2ps_f16c(local_110[0]);
        auVar19 = vmaskmovps_avx(local_a0,auVar19);
        *pauVar12 = auVar19;
      }
    }
    p_Var9 = this->_vptr_Cast_x86_avx2[-3];
    iVar16 = *(int *)(&this->field_0xd0 + (long)p_Var9);
  }
  if (iVar16 == 4) {
    if (*(int *)(&this->field_0xd4 + (long)p_Var9) != 1) {
      return 0;
    }
    iVar15 = 0;
    iVar16 = 0;
    if (0 < _c) {
      iVar16 = _c;
    }
    for (; iVar15 != iVar16; iVar15 = iVar15 + 1) {
      Mat::channel((Mat *)local_110,bottom_blob,iVar15);
      pauVar13 = (undefined1 (*) [16])local_110[0]._0_8_;
      Mat::~Mat((Mat *)local_110);
      Mat::channel((Mat *)local_110,top_blob,iVar15);
      pauVar17 = (undefined1 (*) [16])local_110[0]._0_8_;
      Mat::~Mat((Mat *)local_110);
      for (iVar5 = iVar6; 0 < iVar5; iVar5 = iVar5 + -1) {
        auVar1 = vlddqu_avx(*pauVar13);
        auVar2 = vpunpcklwd_avx((undefined1  [16])0x0,auVar1);
        auVar1 = vpunpckhwd_avx((undefined1  [16])0x0,auVar1);
        pauVar17[1] = auVar1;
        *pauVar17 = auVar2;
        pauVar13 = pauVar13 + 1;
        pauVar17 = pauVar17 + 2;
      }
      lVar10 = 0;
      for (uVar11 = uVar3 & 7; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
        *(uint *)(*pauVar17 + lVar10 * 2) = (uint)*(ushort *)(*pauVar13 + lVar10) << 0x10;
        lVar10 = lVar10 + 2;
      }
    }
    p_Var9 = this->_vptr_Cast_x86_avx2[-3];
    iVar16 = *(int *)(&this->field_0xd0 + (long)p_Var9);
  }
  if (iVar16 != 1) {
    return 0;
  }
LAB_002bf235:
  if (*(int *)(&this->field_0xd4 + (long)p_Var9) == 4) {
    uVar11 = uVar3 & 0xf;
    if (_c < 1) {
      _c = 0;
    }
    for (iVar16 = 0; iVar16 != _c; iVar16 = iVar16 + 1) {
      Mat::channel((Mat *)local_110,bottom_blob,iVar16);
      pauVar12 = (undefined1 (*) [32])local_110[0]._0_8_;
      Mat::~Mat((Mat *)local_110);
      Mat::channel((Mat *)local_110,top_blob,iVar16);
      pauVar14 = (undefined1 (*) [32])local_110[0]._0_8_;
      Mat::~Mat((Mat *)local_110);
      for (iVar6 = (int)uVar3 >> 4; 0 < iVar6; iVar6 = iVar6 + -1) {
        auVar19 = vpsrld_avx2(*pauVar12,0x10);
        auVar20 = vpsrld_avx2(pauVar12[1],0x10);
        auVar19 = vpackusdw_avx2(auVar19,auVar20);
        auVar19 = vpermq_avx2(auVar19,0xd8);
        *pauVar14 = auVar19;
        pauVar12 = pauVar12 + 2;
        pauVar14 = pauVar14 + 1;
      }
      uVar7 = uVar11;
      if (7 < uVar11) {
        auVar19 = vpsrld_avx2(*pauVar12,0x10);
        auVar1 = vpackusdw_avx(auVar19._0_16_,auVar19._16_16_);
        *(undefined1 (*) [16])*pauVar14 = auVar1;
        pauVar12 = pauVar12 + 1;
        pauVar14 = (undefined1 (*) [32])(*pauVar14 + 0x10);
        uVar7 = uVar11 - 8;
      }
      lVar10 = 0;
      for (; 0 < (int)uVar7; uVar7 = uVar7 - 1) {
        *(undefined2 *)(*pauVar14 + lVar10) = *(undefined2 *)(*pauVar12 + lVar10 * 2 + 2);
        lVar10 = lVar10 + 2;
      }
    }
  }
  return 0;
}

Assistant:

int Cast_x86_avx2::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if __AVX2__
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;
    if (type_from == 1 && type_to == 2)
    {
        int nn = size >> 3;
        int remain = size - (nn << 3);
        m256i mask = {_mm256_setzero_si256()};
        for (int i = 0; i < remain; i++)
            mask.m256i_u32[i] = 0x80000000;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            unsigned short* outptr = top_blob.channel(q);

            for (int i = 0; i < nn; i++)
            {
                __m256 fp32 = _mm256_loadu_ps(ptr);
                __m128i fp16 = _mm256_cvtps_ph(fp32, _MM_FROUND_TRUNC);
                _mm_store_si128((__m128i*)outptr, fp16);
                ptr += 8;
                outptr += 8;
            }

            if (remain > 0)
            {
                __m256 fp32 = _mm256_maskload_ps(ptr, mask.vec);
                m128i fp16 = {_mm256_cvtps_ph(fp32, _MM_FROUND_TRUNC)};
                memcpy(outptr, fp16.m128i_u16, remain * sizeof(unsigned short));
            }
        }
    }

    if (type_from == 2 && type_to == 1)
    {
        int nn = size >> 3;
        int remain = size - (nn << 3);
        m256i mask = {_mm256_setzero_si256()};
        for (int i = 0; i < remain; i++)
            mask.m256i_u32[i] = 0x80000000;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const unsigned short* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < nn; i++)
            {
                __m128i fp16 = _mm_lddqu_si128((__m128i const*)ptr);
                __m256 fp32 = _mm256_cvtph_ps(fp16);
                _mm256_storeu_ps(outptr, fp32);
                ptr += 8;
                outptr += 8;
            }

            if (remain > 0)
            {
                m128i fp16 = {_mm_setzero_si128()};
                memcpy(fp16.m128i_u16, ptr, remain * sizeof(unsigned short));
                __m256 fp32 = _mm256_cvtph_ps(fp16.vec);
                _mm256_maskstore_ps(outptr, mask.vec, fp32);
            }
        }
    }
    if (type_from == 4 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const unsigned short* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            int nn = size >> 3;
            int remain = size & 7;
            for (; nn > 0; nn--)
            {
                _mm256_storeu_ps(outptr, bfloat2float_avx(_mm_lddqu_si128((__m128i const*)ptr)));
                ptr += 8;
                outptr += 8;
            }

            for (; remain > 0; remain--)
            {
                *outptr = bfloat16_to_float32(*ptr);
                outptr++;
                ptr++;
            }
        }
    }
    if (type_from == 1 && type_to == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            unsigned short* outptr = top_blob.channel(q);
            int nn = size >> 4;
            int remain = size & 15;
            for (; nn > 0; nn--)
            {
                _mm256_storeu_si256((__m256i*)outptr, float2bfloat_avx(_mm256_loadu_ps(ptr), _mm256_loadu_ps(ptr + 8)));
                ptr += 16;
                outptr += 16;
            }
            if (remain >= 8)
            {
                remain -= 8;
                _mm_store_si128((__m128i*)outptr, float2bfloat_avx(_mm256_loadu_ps(ptr)));
                ptr += 8;
                outptr += 8;
            }
            for (; remain > 0; remain--)
            {
                *outptr = float32_to_bfloat16(*ptr);
                outptr++;
                ptr++;
            }
        }
    }

    return 0;
#else // __AVX__

    return Cast::forward(bottom_blob, top_blob, opt);

#endif // __AVX__
}